

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

string * __thiscall
kratos::VarSlice::to_string_abi_cxx11_(string *__return_storage_ptr__,VarSlice *this)

{
  int iVar1;
  uint uVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  long *local_68;
  long lStack_60;
  ulong local_58;
  ulong local_48;
  long *local_38;
  long lStack_30;
  long local_28 [2];
  
  (*(this->parent_var->super_IRNode)._vptr_IRNode[0x1f])(&local_38);
  uVar2 = this->high;
  if (uVar2 == this->low) {
    if (uVar2 == 0) {
      iVar1 = (*(this->parent_var->super_IRNode)._vptr_IRNode[7])();
      if (iVar1 == 1) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,local_38,lStack_30 + (long)local_38);
        goto LAB_0018fd94;
      }
      uVar2 = this->high;
    }
    local_58 = (ulong)uVar2;
    local_68 = local_38;
    lStack_60 = lStack_30;
    format_str_00.size_ = 0x2d;
    format_str_00.data_ = (char *)0x8;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_68;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)"{0}[{1}]",format_str_00,args_00);
  }
  else {
    local_68 = local_38;
    lStack_60 = lStack_30;
    format_str.size_ = 0x22d;
    format_str.data_ = (char *)0xc;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_68;
    local_58 = (ulong)uVar2;
    local_48 = (ulong)this->low;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)"{0}[{1}:{2}]",format_str,args);
  }
LAB_0018fd94:
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VarSlice::to_string() const {
    auto const &parent_name = parent_var->to_string();
    if (high == low) {
        if (high == 0 && parent_var->width() == 1) {
            return parent_name;
        }
        return ::format("{0}[{1}]", parent_name, high);
    } else {
        return ::format("{0}[{1}:{2}]", parent_name, high, low);
    }
}